

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.cpp
# Opt level: O2

int __thiscall ncnn::Normalize::forward_inplace(Normalize *this,Mat *bottom_top_blob,Option *opt)

{
  uint _w;
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  int *piVar5;
  int q_1;
  void *pvVar6;
  int q;
  ulong uVar7;
  uint _w_00;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  float *pfVar11;
  int i_3;
  ulong uVar12;
  long lVar13;
  int iVar14;
  bool bVar15;
  float ssum;
  float fVar16;
  float fVar17;
  float fVar18;
  Mat local_78;
  
  _w = bottom_top_blob->c;
  _w_00 = bottom_top_blob->h * bottom_top_blob->w;
  sVar2 = bottom_top_blob->elemsize;
  iVar14 = this->across_spatial;
  iVar1 = this->across_channel;
  if (iVar1 == 0 || iVar14 == 0) {
    if (iVar14 != 0 && iVar1 == 0) {
      pvVar6 = bottom_top_blob->data;
      iVar14 = this->channel_shared;
      uVar7 = 0;
      uVar8 = (ulong)_w_00;
      if ((int)_w_00 < 1) {
        uVar8 = uVar7;
      }
      iVar1 = this->eps_mode;
      uVar9 = (ulong)_w;
      if ((int)_w < 1) {
        uVar9 = uVar7;
      }
      sVar3 = bottom_top_blob->cstep;
      uVar10 = 0;
      do {
        if (uVar10 == uVar9) {
          return 0;
        }
        fVar16 = 0.0;
        for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
          fVar17 = *(float *)((long)pvVar6 + uVar12 * 4);
          fVar16 = fVar16 + fVar17 * fVar17;
        }
        if (iVar1 == 0) {
          fVar16 = fVar16 + this->eps;
LAB_003aeabe:
          fVar17 = SQRT(fVar16);
        }
        else {
          if (iVar1 != 1) {
            if (fVar16 <= this->eps) {
              fVar16 = this->eps;
            }
            goto LAB_003aeabe;
          }
          fVar17 = SQRT(fVar16);
          if (SQRT(fVar16) <= this->eps) {
            fVar17 = this->eps;
          }
        }
        uVar12 = uVar10 & 0xffffffff;
        if (iVar14 != 0) {
          uVar12 = uVar7;
        }
        fVar16 = *(float *)((long)(this->scale_data).data + uVar12 * 4);
        for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
          *(float *)((long)pvVar6 + uVar12 * 4) =
               *(float *)((long)pvVar6 + uVar12 * 4) * fVar16 * (1.0 / fVar17);
        }
        uVar10 = uVar10 + 1;
        pvVar6 = (void *)((long)pvVar6 + sVar2 * sVar3);
      } while( true );
    }
    if (iVar1 == 0 || iVar14 != 0) {
      return 0;
    }
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,_w_00,sVar2,opt->workspace_allocator);
    iVar14 = -100;
    if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
      if (this->channel_shared == 0) {
        iVar14 = this->eps_mode;
        uVar7 = 0;
        uVar8 = (ulong)_w;
        if ((int)_w < 1) {
          uVar8 = uVar7;
        }
        uVar9 = (ulong)_w_00;
        if ((int)_w_00 < 1) {
          uVar9 = uVar7;
        }
        uVar10 = 0;
        while( true ) {
          pvVar6 = bottom_top_blob->data;
          lVar13 = bottom_top_blob->elemsize * bottom_top_blob->cstep;
          if (uVar10 == uVar9) break;
          pfVar11 = (float *)((long)pvVar6 + uVar7);
          fVar16 = 0.0;
          uVar12 = uVar8;
          while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
            fVar16 = fVar16 + *pfVar11 * *pfVar11;
            pfVar11 = (float *)((long)pfVar11 + lVar13);
          }
          if (iVar14 == 0) {
            fVar16 = fVar16 + this->eps;
LAB_003aee8e:
            fVar17 = SQRT(fVar16);
          }
          else {
            if (iVar14 != 1) {
              if (fVar16 <= this->eps) {
                fVar16 = this->eps;
              }
              goto LAB_003aee8e;
            }
            fVar17 = SQRT(fVar16);
            if (SQRT(fVar16) <= this->eps) {
              fVar17 = this->eps;
            }
          }
          *(float *)((long)local_78.data + uVar10 * 4) = 1.0 / fVar17;
          uVar10 = uVar10 + 1;
          uVar7 = uVar7 + 4;
        }
        pvVar4 = (this->scale_data).data;
        iVar14 = 0;
        for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
          fVar16 = *(float *)((long)pvVar4 + uVar7 * 4);
          for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar6 + uVar10 * 4) =
                 *(float *)((long)pvVar6 + uVar10 * 4) * fVar16 *
                 *(float *)((long)local_78.data + uVar10 * 4);
          }
          pvVar6 = (void *)((long)pvVar6 + lVar13);
        }
      }
      else {
        fVar16 = *(this->scale_data).data;
        iVar14 = this->eps_mode;
        uVar7 = 0;
        uVar8 = (ulong)_w;
        if ((int)_w < 1) {
          uVar8 = uVar7;
        }
        uVar9 = (ulong)_w_00;
        if ((int)_w_00 < 1) {
          uVar9 = uVar7;
        }
        uVar10 = 0;
        while( true ) {
          pvVar6 = bottom_top_blob->data;
          lVar13 = bottom_top_blob->elemsize * bottom_top_blob->cstep;
          if (uVar10 == uVar9) break;
          pfVar11 = (float *)((long)pvVar6 + uVar7);
          fVar17 = 0.0;
          uVar12 = uVar8;
          while (bVar15 = uVar12 != 0, uVar12 = uVar12 - 1, bVar15) {
            fVar17 = fVar17 + *pfVar11 * *pfVar11;
            pfVar11 = (float *)((long)pfVar11 + lVar13);
          }
          if (iVar14 == 0) {
            fVar17 = fVar17 + this->eps;
LAB_003aec9a:
            fVar18 = SQRT(fVar17);
          }
          else {
            if (iVar14 != 1) {
              if (fVar17 <= this->eps) {
                fVar17 = this->eps;
              }
              goto LAB_003aec9a;
            }
            fVar18 = SQRT(fVar17);
            if (SQRT(fVar17) <= this->eps) {
              fVar18 = this->eps;
            }
          }
          *(float *)((long)local_78.data + uVar10 * 4) = fVar16 / fVar18;
          uVar10 = uVar10 + 1;
          uVar7 = uVar7 + 4;
        }
        iVar14 = 0;
        for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
          for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
            *(float *)((long)pvVar6 + uVar10 * 4) =
                 *(float *)((long)local_78.data + uVar10 * 4) *
                 *(float *)((long)pvVar6 + uVar10 * 4);
          }
          pvVar6 = (void *)((long)pvVar6 + lVar13);
        }
      }
    }
    piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar5 == (int *)0x0) {
      return iVar14;
    }
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 != 0) {
      return iVar14;
    }
    if (local_78.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_78.allocator + 0x18))();
      return iVar14;
    }
    goto LAB_003aef0d;
  }
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,_w,sVar2,opt->workspace_allocator);
  iVar14 = -100;
  if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
    sVar2 = bottom_top_blob->cstep;
    sVar3 = bottom_top_blob->elemsize;
    uVar7 = 0;
    uVar8 = (ulong)_w_00;
    if ((int)_w_00 < 1) {
      uVar8 = uVar7;
    }
    pvVar6 = bottom_top_blob->data;
    uVar9 = (ulong)_w;
    if ((int)_w < 1) {
      uVar9 = uVar7;
    }
    for (; fVar16 = 0.0, uVar7 != uVar9; uVar7 = uVar7 + 1) {
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        fVar17 = *(float *)((long)pvVar6 + uVar10 * 4);
        fVar16 = fVar16 + fVar17 * fVar17;
      }
      *(float *)((long)local_78.data + uVar7 * 4) = fVar16;
      pvVar6 = (void *)((long)pvVar6 + sVar2 * sVar3);
    }
    for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      fVar16 = fVar16 + *(float *)((long)local_78.data + uVar7 * 4);
    }
    if (this->eps_mode == 0) {
      fVar16 = fVar16 + this->eps;
LAB_003aecfb:
      fVar17 = SQRT(fVar16);
    }
    else {
      if (this->eps_mode != 1) {
        if (fVar16 <= this->eps) {
          fVar16 = this->eps;
        }
        goto LAB_003aecfb;
      }
      fVar17 = SQRT(fVar16);
      if (SQRT(fVar16) <= this->eps) {
        fVar17 = this->eps;
      }
    }
    if (this->channel_shared == 0) {
      sVar2 = bottom_top_blob->cstep;
      sVar3 = bottom_top_blob->elemsize;
      pvVar6 = bottom_top_blob->data;
      pvVar4 = (this->scale_data).data;
      iVar14 = 0;
      for (uVar7 = 0; uVar7 != uVar9; uVar7 = uVar7 + 1) {
        fVar16 = *(float *)((long)pvVar4 + uVar7 * 4);
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          *(float *)((long)pvVar6 + uVar10 * 4) =
               *(float *)((long)pvVar6 + uVar10 * 4) * fVar16 * (1.0 / fVar17);
        }
        pvVar6 = (void *)((long)pvVar6 + sVar2 * sVar3);
      }
    }
    else {
      fVar16 = *(this->scale_data).data;
      pvVar6 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->cstep;
      sVar3 = bottom_top_blob->elemsize;
      iVar14 = 0;
      for (uVar7 = 0; uVar7 != uVar9; uVar7 = uVar7 + 1) {
        for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
          *(float *)((long)pvVar6 + uVar10 * 4) =
               *(float *)((long)pvVar6 + uVar10 * 4) * (1.0 / fVar17) * fVar16;
        }
        pvVar6 = (void *)((long)pvVar6 + sVar2 * sVar3);
      }
    }
  }
  piVar5 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar5 == (int *)0x0) {
    return iVar14;
  }
  LOCK();
  *piVar5 = *piVar5 + -1;
  UNLOCK();
  if (*piVar5 != 0) {
    return iVar14;
  }
  if (local_78.allocator != (Allocator *)0x0) {
    (**(code **)(*(long *)local_78.allocator + 0x18))();
    return iVar14;
  }
LAB_003aef0d:
  free(local_78.data);
  return iVar14;
}

Assistant:

int Normalize::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    if (across_spatial && across_channel)
    {
        // square
        Mat square_sum_blob;
        square_sum_blob.create(channels, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            float ssum = 0.f;
            for (int i = 0; i < size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            square_sum_blob[q] = ssum;
        }

        float ssum = 0.f;
        for (int q = 0; q < channels; q++)
        {
            ssum += square_sum_blob[q];
        }

        float a;
        if (eps_mode == 0) // caffe/mxnet
        {
            a = 1.f / sqrtf(ssum + eps);
        }
        else if (eps_mode == 1) // pytorch
        {
            a = 1.f / std::max(sqrtf(ssum), eps);
        }
        else //if (eps_mode == 2) // tensorflow
        {
            a = 1.f / sqrt(std::max(ssum, eps));
        }

        if (channel_shared)
        {
            float scale = a * scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                float scale = a * scale_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * scale;
                }
            }
        }

        return 0;
    }

    if (across_spatial && !across_channel)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float ssum = 0.f;
            for (int i = 0; i < size; i++)
            {
                ssum += ptr[i] * ptr[i];
            }

            float a;
            if (eps_mode == 0) // caffe/mxnet
            {
                a = 1.f / sqrtf(ssum + eps);
            }
            else if (eps_mode == 1) // pytorch
            {
                a = 1.f / std::max(sqrtf(ssum), eps);
            }
            else //if (eps_mode == 2) // tensorflow
            {
                a = 1.f / sqrtf(std::max(ssum, eps));
            }

            float scale = a * (channel_shared ? scale_data[0] : scale_data[q]);

            for (int i = 0; i < size; i++)
            {
                ptr[i] = ptr[i] * scale;
            }
        }

        return 0;
    }

    if (!across_spatial && across_channel)
    {
        // square sum, 1 / sqrt(ssum)
        Mat square_sum_blob;
        square_sum_blob.create(size, elemsize, opt.workspace_allocator);
        if (square_sum_blob.empty())
            return -100;

        if (channel_shared)
        {
            float scale = scale_data[0];

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < size; i++)
            {
                float ssum = 0.f;
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_top_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                float a;
                if (eps_mode == 0) // caffe/mxnet
                {
                    a = 1.f / sqrtf(ssum + eps);
                }
                else if (eps_mode == 1) // pytorch
                {
                    a = 1.f / std::max((float)sqrt(ssum), eps);
                }
                else //if (eps_mode == 2) // tensorflow
                {
                    a = 1.f / sqrtf(std::max(ssum, eps));
                }

                square_sum_blob[i] = a * scale;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * square_sum_blob[i];
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < size; i++)
            {
                float ssum = 0.f;
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_top_blob.channel(q);
                    ssum += ptr[i] * ptr[i];
                }

                float a;
                if (eps_mode == 0) // caffe/mxnet
                {
                    a = 1.f / sqrtf(ssum + eps);
                }
                else if (eps_mode == 1) // pytorch
                {
                    a = 1.f / std::max(sqrtf(ssum), eps);
                }
                else //if (eps_mode == 2) // tensorflow
                {
                    a = 1.f / sqrtf(std::max(ssum, eps));
                }

                square_sum_blob[i] = a;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                float scale = scale_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = ptr[i] * square_sum_blob[i] * scale;
                }
            }
        }

        return 0;
    }

    return 0;
}